

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureBufferActiveUniformValidation::iterate(TextureBufferActiveUniformValidation *this)

{
  ostringstream *poVar1;
  _Rb_tree_header *p_Var2;
  ostringstream *this_00;
  pointer pTVar3;
  GLenum GVar4;
  TextureBufferActiveUniformValidation *pTVar5;
  pointer __s1;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  ulong uVar9;
  TextureParameters *pTVar10;
  char *pcVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  GLuint i;
  uint uVar14;
  GLenum paramVal;
  GLint n_active_uniforms;
  uint local_260;
  GLenum uniformType;
  uint local_258;
  GLint type;
  long local_250;
  TextureBufferActiveUniformValidation *local_248;
  GLsizei uniformSize;
  GLsizei paramLength;
  vector<int,_std::allocator<int>_> types;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indicies;
  vector<char,_std::allocator<char>_> nameValue;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  resultTypes;
  undefined1 local_1b0 [384];
  long lVar8;
  
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])();
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 0x1680))(this->m_po_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xe3);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&this->m_texture_params,this->m_tbo_tex_ids);
  (**(code **)(lVar8 + 0x9d8))(this->m_po_id,0x8b86,&n_active_uniforms);
  local_250 = lVar8;
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Error getting value of GL_ACTIVE_UNIFORMS!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0xec);
  uVar9 = ((long)(this->m_texture_params).
                 super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_texture_params).
                super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  local_260 = (uint)CONCAT71((int7)(uVar9 >> 8),uVar9 == (uint)n_active_uniforms);
  if (uVar9 != (uint)n_active_uniforms) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Result is different than expected!\n");
    std::operator<<((ostream *)poVar1,"Expected number of active uniforms: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,"\n");
    std::operator<<((ostream *)poVar1,"Result   number of active uniforms: ");
    std::ostream::operator<<(poVar1,n_active_uniforms);
    std::operator<<((ostream *)poVar1,"\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::vector<char,_std::allocator<char>_>::vector(&nameValue,100,(allocator_type *)local_1b0);
  paramLength = 0;
  uniformSize = 0;
  p_Var2 = &resultTypes._M_t._M_impl.super__Rb_tree_header;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0;
  local_248 = this;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  do {
    pTVar5 = local_248;
    if ((uint)n_active_uniforms <=
        (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      uVar9 = 0;
      uVar14 = n_active_uniforms;
      do {
        if (uVar14 <= uVar9) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&indicies,(long)(int)uVar14,(allocator_type *)local_1b0);
          std::vector<int,_std::allocator<int>_>::vector
                    (&types,(long)n_active_uniforms,(allocator_type *)local_1b0);
          pTVar5 = local_248;
          uVar14 = local_260;
          for (uVar9 = 0; uVar9 < (uint)n_active_uniforms; uVar9 = uVar9 + 1) {
            indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] = (uint)uVar9;
          }
          (**(code **)(local_250 + 0x770))
                    (local_248->m_po_id,(ulong)(uint)n_active_uniforms,
                     indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,0x8a37,
                     CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start));
          dVar7 = (**(code **)(local_250 + 0x800))();
          glu::checkError(dVar7,"Error getting information about active uniform variables!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                          ,0x142);
          paramVal = 0;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          while( true ) {
            if ((uint)n_active_uniforms <= paramVal) break;
            pmVar12 = std::
                      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[](&resultTypes,&paramVal);
            if (*pmVar12 !=
                *(mapped_type *)
                 (CONCAT44(types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) + (ulong)paramVal * 4)) {
              local_1b0._0_8_ =
                   ((pTVar5->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"Wrong uniform type for index(");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::operator<<((ostream *)poVar1,")\n");
              std::operator<<((ostream *)poVar1,"expected uniform type: ");
              pmVar12 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[](&resultTypes,&paramVal);
              pcVar11 = getUniformTypeName(pTVar5,*pmVar12);
              std::operator<<((ostream *)poVar1,pcVar11);
              std::operator<<((ostream *)poVar1,"\n");
              std::operator<<((ostream *)poVar1,"result   uniform type: ");
              pcVar11 = getUniformTypeName(pTVar5,*(GLenum *)
                                                   (CONCAT44(types.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)types.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                                  (ulong)paramVal * 4));
              std::operator<<((ostream *)poVar1,pcVar11);
              std::operator<<((ostream *)poVar1,"\n");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              uVar14 = 0;
            }
            paramVal = paramVal + 1;
          }
          type = -1;
          paramVal = 0x92fa;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          for (local_258 = 0; local_258 < (uint)n_active_uniforms; local_258 = local_258 + 1) {
            (**(code **)(local_250 + 0x9c8))(pTVar5->m_po_id,0x92e1,local_258,1,&paramVal,1,0);
            dVar7 = (**(code **)(local_250 + 0x800))();
            glu::checkError(dVar7,"Error getting information about one of program resources!",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                            ,0x159);
            pmVar12 = std::
                      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      ::operator[](&resultTypes,&local_258);
            if (*pmVar12 != type) {
              local_1b0._0_8_ =
                   ((pTVar5->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"Wrong uniform type for index(");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::operator<<((ostream *)poVar1,")\n");
              std::operator<<((ostream *)poVar1,"expected uniform type: ");
              pmVar12 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[](&resultTypes,&local_258);
              pcVar11 = getUniformTypeName(pTVar5,*pmVar12);
              std::operator<<((ostream *)poVar1,pcVar11);
              std::operator<<((ostream *)poVar1,"\n");
              std::operator<<((ostream *)poVar1,"result   uniform type: ");
              pcVar11 = getUniformTypeName(pTVar5,type);
              std::operator<<((ostream *)poVar1,pcVar11);
              std::operator<<((ostream *)poVar1,"\n");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              uVar14 = 0;
            }
          }
          pcVar11 = "Fail";
          if ((uVar14 & 1) != 0) {
            pcVar11 = "Pass";
          }
          tcu::TestContext::setTestResult
                    ((pTVar5->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     (byte)~(byte)uVar14 & QP_TEST_RESULT_FAIL,pcVar11);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&types.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&indicies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::~_Rb_tree(&resultTypes._M_t);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&nameValue.super__Vector_base<char,_std::allocator<char>_>);
          return STOP;
        }
        pTVar3 = (this->m_texture_params).
                 super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (p_Var13 = resultTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pTVar5 = local_248, (_Rb_tree_header *)p_Var13 != p_Var2;
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          if (*(GLenum *)&p_Var13[1].field_0x4 == pTVar3[uVar9].m_texture_uniform_type) {
            if ((_Rb_tree_header *)p_Var13 != p_Var2) goto LAB_00d2caa8;
            break;
          }
        }
        local_1b0._0_8_ =
             ((local_248->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "Following uniform type is missing from active uniforms list: ");
        pcVar11 = getUniformTypeName(pTVar5,(pTVar5->m_texture_params).
                                            super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                            m_texture_uniform_type);
        std::operator<<((ostream *)poVar1,pcVar11);
        std::operator<<((ostream *)poVar1,"\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        local_260 = 0;
        uVar14 = n_active_uniforms;
LAB_00d2caa8:
        uVar9 = uVar9 + 1;
      } while( true );
    }
    (**(code **)(local_250 + 0x750))
              (local_248->m_po_id,
               (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,99,&paramLength,&uniformSize,&uniformType,
               nameValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar7 = (**(code **)(local_250 + 0x800))();
    glu::checkError(dVar7,"Error getting information about active uniform variable!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x106);
    pTVar10 = getParamsForType(pTVar5,uniformType);
    __s1 = nameValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
    if (pTVar10 == (TextureParameters *)0x0) {
      local_1b0._0_8_ =
           ((pTVar5->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Following uniform type was not expected to be defined in current program : \n"
                     );
      pcVar11 = getUniformTypeName(pTVar5,uniformType);
      std::operator<<((ostream *)this_00,pcVar11);
      std::operator<<((ostream *)this_00,"\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d2c9a0:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      local_260 = 0;
    }
    else {
      std::__cxx11::string::string((string *)local_1b0,(string *)&pTVar10->m_uniform_name);
      iVar6 = strncmp(__s1,(char *)local_1b0._0_8_,100);
      std::__cxx11::string::~string((string *)local_1b0);
      if (iVar6 != 0) {
        local_1b0._0_8_ =
             ((pTVar5->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"For :");
        pcVar11 = getUniformTypeName(pTVar5,uniformType);
        std::operator<<((ostream *)poVar1,pcVar11);
        std::operator<<((ostream *)poVar1," type name \n");
        std::operator<<((ostream *)poVar1,"expected  uniform name is: ");
        std::__cxx11::string::string((string *)&indicies,(string *)&pTVar10->m_uniform_name);
        std::operator<<((ostream *)poVar1,
                        (char *)indicies.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        std::operator<<((ostream *)poVar1,"\n");
        std::operator<<((ostream *)poVar1,"result    uniform name is: ");
        std::operator<<((ostream *)poVar1,
                        nameValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        std::operator<<((ostream *)poVar1,"\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&indicies);
        goto LAB_00d2c9a0;
      }
    }
    GVar4 = uniformType;
    pmVar12 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[](&resultTypes,(key_type *)&types);
    *pmVar12 = GVar4;
    types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = (uint)types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureBufferActiveUniformValidation::iterate(void)
{
	/* Initialize */
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	/* Configure Program */
	configureProgram(&m_texture_params, m_tbo_tex_ids);

	/* Get number of active uniforms for current program */
	glw::GLint n_active_uniforms;

	gl.getProgramiv(m_po_id, GL_ACTIVE_UNIFORMS, &n_active_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting value of GL_ACTIVE_UNIFORMS!");

	if ((glw::GLuint)n_active_uniforms != m_texture_params.size())
	{
		/* Log error if number of active uniforms different than expected */
		m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected!\n"
						   << "Expected number of active uniforms: " << m_texture_params.size() << "\n"
						   << "Result   number of active uniforms: " << n_active_uniforms << "\n"
						   << tcu::TestLog::EndMessage;

		testResult = false;
	}

	/* Retrieve parameters for specific indices */
	std::vector<glw::GLchar> nameValue(m_param_value_size);
	glw::GLsizei			 paramLength = 0;
	glw::GLsizei			 uniformSize = 0;
	glw::GLenum				 uniformType;

	/* store map of indices and uniform types */
	std::map<glw::GLuint, glw::GLenum> resultTypes;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getActiveUniform(m_po_id, i /* index */, (glw::GLsizei)(m_param_value_size - 1), &paramLength, &uniformSize,
							&uniformType, &nameValue[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variable!");

		/*Check if returned uniform type is one of types defined in current program*/
		const TextureParameters* param = getParamsForType(uniformType);

		if (0 == param)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type was not expected to be defined in current program : \n"
							   << getUniformTypeName(uniformType) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
		else if (strncmp(&nameValue[0], param->get_uniform_name().c_str(), m_param_value_size))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "For :" << getUniformTypeName(uniformType) << " type name \n"
							   << "expected  uniform name is: " << param->get_uniform_name().c_str() << "\n"
							   << "result    uniform name is: " << &nameValue[0] << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}

		resultTypes[i] = uniformType;
	}

	/* Check if all uniform types defined in program were returned */
	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected uniform type is missing */
		std::map<glw::GLuint, glw::GLenum>::iterator it = resultTypes.begin();
		for (; it != resultTypes.end(); ++it)
		{
			if (it->second == m_texture_params[i].get_texture_uniform_type())
			{
				break;
			}
		}

		/* Log if there is some missing uniform type */
		if (it == resultTypes.end())
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Following uniform type is missing from active uniforms list: "
							   << getUniformTypeName(m_texture_params[i].get_texture_uniform_type()) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	/* Get all active uniform types using glGetActiveUniformsiv and compare with results from glGetActiveUniform function */
	std::vector<glw::GLuint> indicies(n_active_uniforms);
	std::vector<glw::GLint>  types(n_active_uniforms);

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		indicies[i] = i;
	}

	gl.getActiveUniformsiv(m_po_id, n_active_uniforms, &indicies[0], GL_UNIFORM_TYPE, &types[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about active uniform variables!");

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		/* Log error if expected result is different from expected*/
		if (resultTypes[i] != (glw::GLuint)types[i])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(types[i]) << "\n"
							   << tcu::TestLog::EndMessage;

			testResult = false;
		}
	}

	glw::GLenum paramVal = GL_TYPE;
	glw::GLint  type	 = -1;

	for (glw::GLuint i = 0; i < (glw::GLuint)n_active_uniforms; ++i)
	{
		gl.getProgramResourceiv(m_po_id, GL_UNIFORM, i /*index */, 1 /* parameters count */,
								&paramVal /* parameter enum */, 1 /* buffer size */, 0, &type);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting information about one of program resources!");

		if (resultTypes[i] != (glw::GLuint)type)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong uniform type for index(" << i << ")\n"
							   << "expected uniform type: " << getUniformTypeName(resultTypes[i]) << "\n"
							   << "result   uniform type: " << getUniformTypeName(type) << "\n"
							   << tcu::TestLog::EndMessage;
			testResult = false;
		}
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}